

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

int proxy_open(proxy_handle *ph)

{
  long *plVar1;
  long *result;
  worker_handle *wh;
  long *plVar2;
  char **ppcVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  char *pcVar7;
  undefined8 *puVar8;
  regex_handle *prVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  size_t __nmemb;
  long lVar13;
  ulong uVar14;
  mutex_handle *mutex;
  long lVar15;
  
  plVar2 = (long *)ph->priv;
  result = plVar2 + 0x112;
  conn_port_to_str((ph->conf).port,(char *)result);
  __nmemb = (ulong)(ph->conf).bind_addr_ext_add_len + 1;
  *(int *)(plVar2 + 0x107) = (int)__nmemb;
  pvVar6 = calloc(__nmemb,0x48);
  *plVar2 = (long)pvVar6;
  if (pvVar6 == (void *)0x0) {
    return -0xc;
  }
  pvVar6 = calloc(__nmemb,0x50);
  plVar2[0x103] = (long)pvVar6;
  iVar11 = -0xc;
  iVar5 = iVar11;
  if ((pvVar6 == (void *)0x0) || (iVar5 = log_open((log_handle *)(plVar2 + 0x10c)), iVar5 < 0))
  goto LAB_001049a7;
  pcVar7 = (ph->conf).calls_allowed;
  prVar9 = (regex_handle *)plVar2[0x105];
  if (pcVar7 != (char *)0x0) {
    if (prVar9 == (regex_handle *)0x0) {
      prVar9 = (regex_handle *)calloc(1,8);
      plVar2[0x105] = (long)prVar9;
      iVar5 = iVar11;
      if (prVar9 == (regex_handle *)0x0) goto LAB_001049a7;
      iVar5 = regex_init(prVar9);
      if (-1 < iVar5) {
        prVar9 = (regex_handle *)plVar2[0x105];
        pcVar7 = (ph->conf).calls_allowed;
        goto LAB_00104492;
      }
      uVar12 = -iVar5;
      pcVar7 = strerror(uVar12);
      pcVar10 = "Failed to initialize allowed callsigns regex (%d): %s\n";
    }
    else {
LAB_00104492:
      iVar5 = regex_compile(prVar9,pcVar7);
      if (-1 < iVar5) goto LAB_001044e6;
      uVar12 = -iVar5;
      pcVar7 = strerror(uVar12);
      pcVar10 = "Failed to compile allowed callsigns regex (%d): %s\n";
    }
    proxy_log(ph,LOG_LEVEL_FATAL,pcVar10,(ulong)uVar12,pcVar7);
    goto LAB_001049a7;
  }
  if (prVar9 != (regex_handle *)0x0) {
    regex_free(prVar9);
    free((void *)plVar2[0x105]);
    plVar2[0x105] = 0;
  }
LAB_001044e6:
  pcVar7 = (ph->conf).calls_denied;
  prVar9 = (regex_handle *)plVar2[0x106];
  if (pcVar7 == (char *)0x0) {
    if (prVar9 != (regex_handle *)0x0) {
      regex_free(prVar9);
      free((void *)plVar2[0x106]);
      plVar2[0x106] = 0;
    }
LAB_00104542:
    lVar13 = 0;
    memset(plVar2 + 3,0,0x800);
    lVar15 = *plVar2;
    *(char **)(lVar15 + 0x10) = (ph->conf).bind_addr_ext;
    plVar1 = plVar2 + 1;
    *(long **)(lVar15 + 0x30) = plVar1;
    plVar2[1] = lVar15;
    iVar5 = (int)plVar2[0x107];
    if (1 < (long)iVar5) {
      ppcVar3 = (ph->conf).bind_addr_ext_add;
      lVar13 = 0;
      lVar4 = lVar15;
      do {
        *(char **)(lVar4 + 0x58) = ppcVar3[lVar13];
        *(undefined8 *)(lVar4 + 0x80) = 0;
        *(undefined8 *)(lVar4 + 0x88) = 0;
        *(long *)(lVar4 + 0x28) = lVar4 + 0x48;
        *(long *)(lVar4 + 0x78) = lVar4 + 0x28;
        lVar13 = lVar13 + 1;
        lVar4 = lVar4 + 0x48;
      } while ((long)iVar5 + -1 != lVar13);
    }
    puVar8 = (undefined8 *)(lVar15 + lVar13 * 0x48 + 0x28);
    *puVar8 = 0;
    plVar2[2] = (long)puVar8;
    if (0 < iVar5) {
      lVar15 = 0;
      uVar14 = 0;
      do {
        lVar13 = *plVar2;
        *(char **)(lVar13 + 0x18 + lVar15) = "5199";
        *(char **)(lVar13 + 0x20 + lVar15) = "5198";
        *(proxy_handle **)(lVar13 + 8 + lVar15) = ph;
        iVar5 = proxy_conn_init((proxy_conn_handle *)(lVar13 + lVar15));
        if (iVar5 < 0) {
          pcVar7 = strerror(-iVar5);
          proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy connection #%d (%d): %s\n",
                    uVar14 & 0xffffffff,(ulong)(uint)-iVar5,pcVar7);
          if (uVar14 != 0) {
            lVar15 = uVar14 + 1;
            do {
              proxy_conn_free((proxy_conn_handle *)((ulong)((int)lVar15 - 2) * 0x48 + *plVar2));
              lVar15 = lVar15 + -1;
            } while (1 < lVar15);
          }
          goto LAB_001049a7;
        }
        uVar14 = uVar14 + 1;
        lVar15 = lVar15 + 0x48;
      } while ((long)uVar14 < (long)(int)plVar2[0x107]);
      if (0 < (int)plVar2[0x107]) {
        lVar15 = plVar2[0x103];
        lVar13 = -0x38;
        uVar14 = 0;
        do {
          mutex = (mutex_handle *)(lVar15 + lVar13 + 0x50);
          *(proxy_handle **)(lVar15 + lVar13 + 0x38) = ph;
          iVar5 = mutex_init(mutex);
          if (iVar5 < 0) {
LAB_0010490e:
            pcVar7 = strerror(-iVar5);
            proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy client worker #%d (%d): %s\n",
                      uVar14 & 0xffffffff,(ulong)(uint)-iVar5,pcVar7);
            if ((int)uVar14 != 0) {
              uVar14 = uVar14 + 1;
              do {
                lVar15 = plVar2[0x103];
                worker_free((worker_handle *)(lVar15 + lVar13 + 8));
                mutex_free((mutex_handle *)(lVar15 + lVar13));
                uVar14 = uVar14 - 1;
                lVar13 = lVar13 + -0x50;
              } while (1 < uVar14);
            }
            iVar11 = (int)plVar2[0x107];
            goto LAB_00104974;
          }
          wh = (worker_handle *)(lVar15 + 0x58 + lVar13);
          wh->func_ctx = (void *)(lVar15 + lVar13 + 0x38);
          wh->func_ptr = proxy_worker_func;
          wh->stack_size = 0x100000;
          iVar5 = worker_init(wh);
          if (iVar5 < 0) {
            mutex_free(mutex);
            goto LAB_0010490e;
          }
          lVar15 = plVar2[0x103];
          *(long *)(lVar15 + lVar13 + 0x48) = plVar2[0x104];
          plVar2[0x104] = lVar15 + lVar13 + 0x38;
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 0x50;
        } while ((long)uVar14 < (long)(int)plVar2[0x107]);
      }
    }
    plVar2[0x109] = (long)(ph->conf).bind_addr;
    plVar2[0x10a] = (long)result;
    iVar5 = conn_listen((conn_handle *)(plVar2 + 0x108));
    if (-1 < iVar5) {
      pcVar7 = (ph->conf).bind_addr;
      if (pcVar7 != (char *)0x0) {
        proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections at %s:%s\n",pcVar7,result);
        return 0;
      }
      proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections on port %s\n",result);
      return 0;
    }
    pcVar7 = strerror(-iVar5);
    proxy_log(ph,LOG_LEVEL_FATAL,"Failed to open listening port (%d): %s\n",(ulong)(uint)-iVar5,
              pcVar7);
    plVar2[0x104] = 0;
    if ((int)plVar2[0x107] < 1) {
      *plVar1 = 0;
      plVar2[2] = 0;
    }
    else {
      lVar15 = 0x18;
      lVar13 = 0;
      do {
        lVar4 = plVar2[0x103];
        worker_free((worker_handle *)(lVar4 + lVar15 + 8));
        mutex_free((mutex_handle *)(lVar4 + lVar15));
        lVar13 = lVar13 + 1;
        iVar11 = (int)plVar2[0x107];
        lVar15 = lVar15 + 0x50;
      } while (lVar13 < iVar11);
LAB_00104974:
      *plVar1 = 0;
      plVar2[2] = 0;
      if (0 < iVar11) {
        lVar13 = 0;
        lVar15 = 0;
        do {
          proxy_conn_free((proxy_conn_handle *)(*plVar2 + lVar13));
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x48;
        } while (lVar15 < (int)plVar2[0x107]);
      }
    }
  }
  else {
    if (prVar9 == (regex_handle *)0x0) {
      prVar9 = (regex_handle *)calloc(1,8);
      plVar2[0x106] = (long)prVar9;
      iVar5 = iVar11;
      if (prVar9 == (regex_handle *)0x0) goto LAB_001049a7;
      iVar5 = regex_init(prVar9);
      if (-1 < iVar5) {
        prVar9 = (regex_handle *)plVar2[0x106];
        pcVar7 = (ph->conf).calls_denied;
        goto LAB_001044ff;
      }
      uVar12 = -iVar5;
      pcVar7 = strerror(uVar12);
      pcVar10 = "Failed to initialize denied callsigns regex (%d): %s\n";
    }
    else {
LAB_001044ff:
      iVar5 = regex_compile(prVar9,pcVar7);
      if (-1 < iVar5) goto LAB_00104542;
      uVar12 = -iVar5;
      pcVar7 = strerror(uVar12);
      pcVar10 = "Failed to compile denied callsigns regex (%d): %s\n";
    }
    proxy_log(ph,LOG_LEVEL_FATAL,pcVar10,(ulong)uVar12,pcVar7);
  }
LAB_001049a7:
  if ((regex_handle *)plVar2[0x105] != (regex_handle *)0x0) {
    regex_free((regex_handle *)plVar2[0x105]);
    free((void *)plVar2[0x105]);
    plVar2[0x105] = 0;
  }
  log_close((log_handle *)(plVar2 + 0x10c));
  free((void *)plVar2[0x103]);
  plVar2[0x103] = 0;
  free((void *)*plVar2);
  *plVar2 = 0;
  *(undefined4 *)(plVar2 + 0x107) = 0;
  return iVar5;
}

Assistant:

int proxy_open(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;
	int ret;

	conn_port_to_str(ph->conf.port, priv->port_str);

	priv->num_clients = 1 + ph->conf.bind_addr_ext_add_len;

	priv->clients = calloc(priv->num_clients, sizeof(*priv->clients));
	if (priv->clients == NULL)
		return -ENOMEM;

	priv->client_workers = calloc(priv->num_clients,
				      sizeof(struct proxy_worker));
	if (priv->client_workers == NULL) {
		ret = -ENOMEM;
		goto proxy_open_exit;
	}

	ret = log_open(&priv->log);
	if (ret < 0)
		goto proxy_open_exit;

	if (ph->conf.calls_allowed != NULL) {
		if (priv->re_calls_allowed == NULL) {
			priv->re_calls_allowed = calloc(1,
				sizeof(*priv->re_calls_allowed));
			if (priv->re_calls_allowed == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_allowed);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize allowed callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_allowed,
				    ph->conf.calls_allowed);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile allowed callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	if (ph->conf.calls_denied != NULL) {
		if (priv->re_calls_denied == NULL) {
			priv->re_calls_denied = calloc(1,
				sizeof(*priv->re_calls_denied));
			if (priv->re_calls_denied == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_denied);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize denied callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_denied,
				    ph->conf.calls_denied);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile denied callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_denied != NULL) {
		regex_free(priv->re_calls_denied);
		free(priv->re_calls_denied);
		priv->re_calls_denied = NULL;
	}

	memset(priv->clients_by_call, 0x0, sizeof(priv->clients_by_call));

	priv->clients[0].source_addr = ph->conf.bind_addr_ext;

	priv->clients[0].prev_ptr = &priv->idle_clients_head;
	priv->idle_clients_head = &priv->clients[0];

	for (i = 1; i < priv->num_clients; i++) {
		priv->clients[i].source_addr = ph->conf.bind_addr_ext_add[i - 1];
		priv->clients[i].prev_by_call_ptr = NULL;
		priv->clients[i].next_by_call = NULL;
		priv->clients[i - 1].next = &priv->clients[i];
		priv->clients[i].prev_ptr = &priv->clients[i - 1].next;
	}

	priv->clients[i - 1].next = NULL;
	priv->idle_clients_tail_ptr = &priv->clients[i - 1].next;

	for (i = 0; i < priv->num_clients; i++) {
		priv->clients[i].control_port = "5199";
		priv->clients[i].data_port = "5198";
		priv->clients[i].ph = ph;
		ret = proxy_conn_init(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_conn_free(&priv->clients[i]);

			goto proxy_open_exit;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		priv->client_workers[i].ph = ph;
		ret = proxy_worker_init(&priv->client_workers[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy client worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_worker_free(&priv->client_workers[i]);

			goto proxy_open_exit_late;
		}

		priv->client_workers[i].next = priv->idle_workers_head;
		priv->idle_workers_head = &priv->client_workers[i];
	}

	priv->conn_listen.source_addr = (const char *)ph->conf.bind_addr;
	priv->conn_listen.source_port = (const char *)priv->port_str;

	ret = conn_listen(&priv->conn_listen);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to open listening port (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_open_exit_later;
	}

	if (ph->conf.bind_addr == NULL)
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections on port %s\n",
			  priv->port_str);
	else
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections at %s:%s\n",
			  ph->conf.bind_addr,
			  priv->port_str);

	return 0;

proxy_open_exit_later:
	priv->idle_workers_head = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_free(&priv->client_workers[i]);

proxy_open_exit_late:
	priv->idle_clients_head = NULL;
	priv->idle_clients_tail_ptr = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_conn_free(&priv->clients[i]);

proxy_open_exit:
	if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	log_close(&priv->log);

	free(priv->client_workers);
	priv->client_workers = NULL;

	free(priv->clients);
	priv->clients = NULL;

	priv->num_clients = 0;

	return ret;
}